

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O2

void png_do_check_palette_indexes(png_structrp png_ptr,png_row_infop row_info)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  
  bVar1 = row_info->bit_depth;
  if (((int)(uint)png_ptr->num_palette < 1 << (bVar1 & 0x1f) && png_ptr->num_palette != 0) &&
     (bVar1 - 1 < 8)) {
    uVar6 = -((uint)row_info->pixel_depth * row_info->width) & 7;
    pbVar2 = png_ptr->row_buf;
    pbVar9 = pbVar2 + row_info->rowbytes;
    switch((uint)bVar1) {
    case 1:
      for (; pbVar2 < pbVar9; pbVar9 = pbVar9 + -1) {
        if (*pbVar9 >> (sbyte)uVar6 != 0) {
          png_ptr->num_palette_max = 1;
        }
        uVar6 = 0;
      }
      break;
    case 2:
      for (; pbVar2 < pbVar9; pbVar9 = pbVar9 + -1) {
        bVar1 = *pbVar9 >> (sbyte)uVar6;
        uVar7 = bVar1 & 3;
        uVar6 = png_ptr->num_palette_max;
        uVar3 = uVar6;
        if ((int)uVar6 < (int)uVar7) {
          uVar3 = uVar7;
        }
        uVar10 = bVar1 >> 2 & 3;
        uVar4 = uVar3;
        if (uVar3 < uVar10) {
          uVar4 = uVar10;
        }
        uVar11 = bVar1 >> 4 & 3;
        uVar8 = uVar4;
        if (uVar4 < uVar11) {
          uVar8 = uVar11;
        }
        uVar5 = (uint)(bVar1 >> 6);
        if (((((int)uVar6 < (int)uVar7) || (uVar3 < uVar10)) || (uVar4 < uVar11)) || (uVar8 < uVar5)
           ) {
          if (uVar8 < uVar5) {
            uVar8 = uVar5;
          }
          png_ptr->num_palette_max = uVar8;
        }
        uVar6 = 0;
      }
      break;
    case 4:
      for (; pbVar2 < pbVar9; pbVar9 = pbVar9 + -1) {
        bVar1 = *pbVar9 >> (sbyte)uVar6;
        uVar7 = bVar1 & 0xf;
        uVar6 = png_ptr->num_palette_max;
        uVar3 = uVar7;
        if ((int)uVar7 <= (int)uVar6) {
          uVar3 = uVar6;
        }
        uVar4 = (uint)(bVar1 >> 4);
        if ((int)uVar6 < (int)uVar7 || uVar3 < uVar4) {
          if (uVar3 < uVar4) {
            uVar3 = uVar4;
          }
          png_ptr->num_palette_max = uVar3;
        }
        uVar6 = 0;
      }
      break;
    case 8:
      for (; pbVar2 < pbVar9; pbVar9 = pbVar9 + -1) {
        if (png_ptr->num_palette_max < (int)(uint)*pbVar9) {
          png_ptr->num_palette_max = (uint)*pbVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_check_palette_indexes(png_structrp png_ptr, png_row_infop row_info)
{
   if (png_ptr->num_palette < (1 << row_info->bit_depth) &&
      png_ptr->num_palette > 0) /* num_palette can be 0 in MNG files */
   {
      /* Calculations moved outside switch in an attempt to stop different
       * compiler warnings.  'padding' is in *bits* within the last byte, it is
       * an 'int' because pixel_depth becomes an 'int' in the expression below,
       * and this calculation is used because it avoids warnings that other
       * forms produced on either GCC or MSVC.
       */
      int padding = PNG_PADBITS(row_info->pixel_depth, row_info->width);
      png_bytep rp = png_ptr->row_buf + row_info->rowbytes;

      switch (row_info->bit_depth)
      {
         case 1:
         {
            /* in this case, all bytes must be 0 so we don't need
             * to unpack the pixels except for the rightmost one.
             */
            for (; rp > png_ptr->row_buf; rp--)
            {
              if ((*rp >> padding) != 0)
                 png_ptr->num_palette_max = 1;
              padding = 0;
            }

            break;
         }

         case 2:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 2) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 6) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 4:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 8:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
               if (*rp > png_ptr->num_palette_max)
                  png_ptr->num_palette_max = (int) *rp;
            }

            break;
         }

         default:
            break;
      }
   }
}